

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O3

void poplocal(void)

{
  Item *pIVar1;
  Item *pIVar2;
  List *item;
  Item *item_00;
  
  item = symlistlist->next;
  if (item != symlistlist) {
    pIVar1 = (item->element).itm;
    item_00 = pIVar1->next;
    if (pIVar1->next != pIVar1) {
      do {
        pIVar2 = item_00->next;
        delete(item_00);
        item_00 = pIVar2;
      } while (pIVar2 != pIVar1);
      item = symlistlist->next;
    }
    delete(item);
    return;
  }
  __assert_fail("symlistlist->next != symlistlist",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/symbol.c"
                ,0x81,"void poplocal()");
}

Assistant:

void poplocal() /* a lot of storage leakage here for symbols we are guaranteed
	not to need */
{
	List *sl;
	Item *i, *j;

	assert(symlistlist->next != symlistlist);
	sl = LST(symlistlist->next);
	for (i = sl->next; i != sl; i = j) {
		j = i->next;
		delete(i);
	}
	delete(symlistlist->next);
}